

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowTabBar::~QMainWindowTabBar(QMainWindowTabBar *this)

{
  QMainWindow *pQVar1;
  QWidget *pQVar2;
  QMainWindowLayout *pQVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QMainWindowLayout *mwLayout;
  QMainWindowTabBar **in_stack_ffffffffffffffb8;
  QWidget *this_00;
  char local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR_metaObject_00d15ca8;
  in_RDI[2] = &PTR__QMainWindowTabBar_00d15e88;
  pQVar1 = qobject_cast<QMainWindow*>((QObject *)0x5f7d0e);
  if (pQVar1 != (QMainWindow *)0x0) {
    this_00 = (QWidget *)in_RDI[5];
    pQVar2 = QWidget::parentWidget((QWidget *)0x5f7d27);
    if ((this_00 != pQVar2) &&
       (pQVar3 = qt_mainwindow_layout((QMainWindow *)0x5f7d4c), pQVar3 != (QMainWindowLayout *)0x0))
    {
      QList<QTabBar*>::removeOne<QMainWindowTabBar*>
                ((QList<QTabBar_*> *)this_00,in_stack_ffffffffffffffb8);
      QSet<QTabBar_*>::remove(&pQVar3->usedTabBars,local_18);
    }
  }
  QPointer<QDockWidget>::~QPointer((QPointer<QDockWidget> *)0x5f7db9);
  QTabBar::~QTabBar((QTabBar *)0x5f7dc3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMainWindowTabBar::~QMainWindowTabBar()
{
    // Use qobject_cast to verify that we are not already in the (QWidget)
    // destructor of mainWindow
    if (!qobject_cast<QMainWindow *>(mainWindow) || mainWindow == parentWidget())
        return;

    // tab bar is not parented to the main window
    // => can only be a dock widget group window
    // => remove itself from used and unused tab bar containers
    auto *mwLayout = qt_mainwindow_layout(mainWindow);
    if (!mwLayout)
        return;
    mwLayout->unusedTabBars.removeOne(this);
    mwLayout->usedTabBars.remove(this);
}